

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O3

void qcc_engine_init(qcc_engine *eng,qcc_arena *arena)

{
  size_t sVar1;
  void *pvVar2;
  ulong size;
  
  sVar1 = qcc_arena_memory_available(arena);
  size = sVar1 / 3;
  pvVar2 = qcc_arena_alloc(arena,size);
  qcc_arena_init(eng->arena,pvVar2,size);
  pvVar2 = qcc_arena_alloc(arena,size);
  qcc_arena_init(eng->arena + 1,pvVar2,size);
  eng->active_arena = eng->arena;
  eng->backup_arena = eng->arena + 1;
  eng->max_tries = 1000;
  eng->required_successes = 100;
  eng->total_tests = 0;
  eng->failed_tests = 0;
  qcc_logger_init(&eng->logger,arena);
  return;
}

Assistant:

void qcc_engine_init(struct qcc_engine *eng, struct qcc_arena *arena)
{
    size_t data_size = qcc_arena_memory_available(arena) / 3;

    void *data = qcc_arena_alloc(arena, data_size);
    qcc_arena_init(eng->arena + 0, data, data_size);

    data = qcc_arena_alloc(arena, data_size);
    qcc_arena_init(eng->arena + 1, data, data_size);

    eng->active_arena = eng->arena + 0;
    eng->backup_arena = eng->arena + 1;

    eng->max_tries = 1000;
    eng->required_successes = 100;
    eng->total_tests = 0;
    eng->failed_tests = 0;

    qcc_logger_init(&eng->logger, arena);
}